

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int TryRun<std::_Bind<int(*(int,char_const**))(int,char_const**)>>
              (_Bind<int_(*(int,_const_char_**))(int,_const_char_**)> *f)

{
  int iVar1;
  stringstream stream;
  
  iVar1 = (*f->_M_f)((f->_M_bound_args).super__Tuple_impl<0UL,_int,_const_char_**>.
                     super__Head_base<0UL,_int,_false>._M_head_impl,
                     (f->_M_bound_args).super__Tuple_impl<0UL,_int,_const_char_**>.
                     super__Tuple_impl<1UL,_const_char_**>.
                     super__Head_base<1UL,_const_char_**,_false>._M_head_impl);
  return iVar1;
}

Assistant:

int TryRun(T f)
{
    try {
        return f();
    } catch (const AdsException& ex) {
        LOG_ERROR("AdsException message: " << ex.what() << '\n');
        return ex.errorCode;
    } catch (const std::exception& ex) {
        LOG_ERROR("Exception: " << ex.what() << '\n');
        return -2;
    } catch (...) {
        LOG_ERROR("Unknown exception\n");
        return -1;
    }
}